

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcHieCec.c
# Opt level: O0

void Abc_NtkDeriveFlatGia_rec(Gia_Man_t *pGia,Abc_Ntk_t *pNtk)

{
  Vec_Ptr_t *p;
  char *pSop_00;
  Abc_Ntk_t *pNtk_00;
  int iVar1;
  int iVar2;
  Abc_Obj_t *pAVar3;
  Abc_Obj_t *pAVar4;
  Abc_Obj_t *pAVar5;
  char *pSop;
  int k;
  int i;
  Abc_Ntk_t *pNtkModel;
  Abc_Obj_t *pTerm;
  Abc_Obj_t *pObj;
  Vec_Ptr_t *vOrder;
  int gFanins [16];
  Abc_Ntk_t *pNtk_local;
  Gia_Man_t *pGia_local;
  
  p = (Vec_Ptr_t *)pNtk->pData;
  gFanins._56_8_ = pNtk;
  for (pSop._4_4_ = 0; iVar1 = Abc_NtkPiNum((Abc_Ntk_t *)gFanins._56_8_), pSop._4_4_ < iVar1;
      pSop._4_4_ = pSop._4_4_ + 1) {
    pAVar3 = Abc_NtkPi((Abc_Ntk_t *)gFanins._56_8_,pSop._4_4_);
    pAVar3 = Abc_ObjFanout0(pAVar3);
    if ((pAVar3->field_6).iTemp < 0) {
      __assert_fail("Abc_ObjFanout0(pTerm)->iTemp >= 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abc/abcHieCec.c"
                    ,0xbd,"void Abc_NtkDeriveFlatGia_rec(Gia_Man_t *, Abc_Ntk_t *)");
    }
  }
  pSop._4_4_ = 0;
  do {
    iVar1 = Vec_PtrSize(p);
    if (iVar1 <= pSop._4_4_) {
      pSop._4_4_ = 0;
      while( true ) {
        iVar1 = Abc_NtkPoNum((Abc_Ntk_t *)gFanins._56_8_);
        if (iVar1 <= pSop._4_4_) {
          return;
        }
        pAVar3 = Abc_NtkPo((Abc_Ntk_t *)gFanins._56_8_,pSop._4_4_);
        pAVar3 = Abc_ObjFanin0(pAVar3);
        if ((pAVar3->field_6).iTemp < 0) break;
        pSop._4_4_ = pSop._4_4_ + 1;
      }
      __assert_fail("Abc_ObjFanin0(pTerm)->iTemp >= 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abc/abcHieCec.c"
                    ,0xf5,"void Abc_NtkDeriveFlatGia_rec(Gia_Man_t *, Abc_Ntk_t *)");
    }
    pAVar3 = (Abc_Obj_t *)Vec_PtrEntry(p,pSop._4_4_);
    iVar1 = Abc_ObjIsNode(pAVar3);
    if (iVar1 == 0) {
      iVar1 = Abc_ObjIsBox(pAVar3);
      if (iVar1 == 0) {
        __assert_fail("Abc_ObjIsBox(pObj)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abc/abcHieCec.c"
                      ,0xe5,"void Abc_NtkDeriveFlatGia_rec(Gia_Man_t *, Abc_Ntk_t *)");
      }
      pNtk_00 = *(Abc_Ntk_t **)&(pAVar3->field_5).iData;
      Abc_NtkFillTemp(pNtk_00);
      iVar1 = Abc_ObjFaninNum(pAVar3);
      iVar2 = Abc_NtkPiNum(pNtk_00);
      if (iVar1 != iVar2) {
        __assert_fail("Abc_ObjFaninNum(pObj) == Abc_NtkPiNum(pNtkModel)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abc/abcHieCec.c"
                      ,0xe9,"void Abc_NtkDeriveFlatGia_rec(Gia_Man_t *, Abc_Ntk_t *)");
      }
      iVar1 = Abc_ObjFanoutNum(pAVar3);
      iVar2 = Abc_NtkPoNum(pNtk_00);
      if (iVar1 != iVar2) {
        __assert_fail("Abc_ObjFanoutNum(pObj) == Abc_NtkPoNum(pNtkModel)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abc/abcHieCec.c"
                      ,0xea,"void Abc_NtkDeriveFlatGia_rec(Gia_Man_t *, Abc_Ntk_t *)");
      }
      for (pSop._0_4_ = 0; iVar1 = Abc_ObjFaninNum(pAVar3), (int)pSop < iVar1;
          pSop._0_4_ = (int)pSop + 1) {
        pAVar4 = Abc_ObjFanin(pAVar3,(int)pSop);
        pAVar4 = Abc_ObjFanin0(pAVar4);
        iVar1 = (pAVar4->field_6).iTemp;
        pAVar4 = Abc_NtkPi(pNtk_00,(int)pSop);
        pAVar4 = Abc_ObjFanout0(pAVar4);
        (pAVar4->field_6).iTemp = iVar1;
      }
      Abc_NtkDeriveFlatGia_rec(pGia,pNtk_00);
      for (pSop._0_4_ = 0; iVar1 = Abc_ObjFanoutNum(pAVar3), (int)pSop < iVar1;
          pSop._0_4_ = (int)pSop + 1) {
        pAVar4 = Abc_ObjFanout(pAVar3,(int)pSop);
        pAVar5 = Abc_NtkPo(pNtk_00,(int)pSop);
        pAVar5 = Abc_ObjFanin0(pAVar5);
        iVar1 = (pAVar5->field_6).iTemp;
        pAVar4 = Abc_ObjFanout0(pAVar4);
        (pAVar4->field_6).iTemp = iVar1;
      }
    }
    else {
      pSop_00 = (char *)(pAVar3->field_5).pData;
      iVar1 = Abc_ObjFaninNum(pAVar3);
      if (0x10 < iVar1) {
        __assert_fail("Abc_ObjFaninNum(pObj) <= 16",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abc/abcHieCec.c"
                      ,0xdb,"void Abc_NtkDeriveFlatGia_rec(Gia_Man_t *, Abc_Ntk_t *)");
      }
      iVar1 = Abc_ObjFaninNum(pAVar3);
      iVar2 = Abc_SopGetVarNum(pSop_00);
      if (iVar1 != iVar2) {
        __assert_fail("Abc_ObjFaninNum(pObj) == Abc_SopGetVarNum(pSop)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abc/abcHieCec.c"
                      ,0xdc,"void Abc_NtkDeriveFlatGia_rec(Gia_Man_t *, Abc_Ntk_t *)");
      }
      for (pSop._0_4_ = 0; iVar1 = Abc_ObjFaninNum(pAVar3), (int)pSop < iVar1;
          pSop._0_4_ = (int)pSop + 1) {
        pAVar4 = Abc_ObjFanin(pAVar3,(int)pSop);
        gFanins[(long)(int)pSop + -2] = (pAVar4->field_6).iTemp;
        if (gFanins[(long)(int)pSop + -2] < 0) {
          __assert_fail("gFanins[k] >= 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abc/abcHieCec.c"
                        ,0xe0,"void Abc_NtkDeriveFlatGia_rec(Gia_Man_t *, Abc_Ntk_t *)");
        }
      }
      iVar1 = Abc_NtkDeriveFlatGiaSop(pGia,(int *)&vOrder,pSop_00);
      pAVar3 = Abc_ObjFanout0(pAVar3);
      (pAVar3->field_6).iTemp = iVar1;
    }
    pSop._4_4_ = pSop._4_4_ + 1;
  } while( true );
}

Assistant:

void Abc_NtkDeriveFlatGia_rec( Gia_Man_t * pGia, Abc_Ntk_t * pNtk )
{
    int gFanins[16];
    Vec_Ptr_t * vOrder = (Vec_Ptr_t *)pNtk->pData;
    Abc_Obj_t * pObj, * pTerm;
    Abc_Ntk_t * pNtkModel;
    int i, k;
    Abc_NtkForEachPi( pNtk, pTerm, i )
        assert( Abc_ObjFanout0(pTerm)->iTemp >= 0 );
    Vec_PtrForEachEntry( Abc_Obj_t *, vOrder, pObj, i )
    {
        if ( Abc_ObjIsNode(pObj) )
        {
            char * pSop = (char *)pObj->pData;
/*
            int nLength = strlen(pSop);
            if ( nLength == 4 ) // buf/inv
            {
                assert( pSop[2] == '1' );
                assert( pSop[0] == '0' || pSop[0] == '1' );
                assert( Abc_ObjFanin0(pObj)->iTemp >= 0 );
                Abc_ObjFanout0(pObj)->iTemp = Abc_LitNotCond( Abc_ObjFanin0(pObj)->iTemp, pSop[0]=='0' );
                continue;
            }
            if ( nLength == 5 ) // and2
            {
                assert( pSop[3] == '1' );
                assert( pSop[0] == '0' || pSop[0] == '1' );
                assert( pSop[1] == '0' || pSop[1] == '1' );
                assert( Abc_ObjFanin0(pObj)->iTemp >= 0 );
                assert( Abc_ObjFanin1(pObj)->iTemp >= 0 );
                Abc_ObjFanout0(pObj)->iTemp = Gia_ManHashAnd( pGia, 
                    Abc_LitNotCond( Abc_ObjFanin0(pObj)->iTemp, pSop[0]=='0' ),
                    Abc_LitNotCond( Abc_ObjFanin1(pObj)->iTemp, pSop[1]=='0' )
                    );
                continue;
            }
*/
            assert( Abc_ObjFaninNum(pObj) <= 16 );
            assert( Abc_ObjFaninNum(pObj) == Abc_SopGetVarNum(pSop) );
            Abc_ObjForEachFanin( pObj, pTerm, k )
            {
                gFanins[k] = pTerm->iTemp;
                assert( gFanins[k] >= 0 );
            }
            Abc_ObjFanout0(pObj)->iTemp = Abc_NtkDeriveFlatGiaSop( pGia, gFanins, pSop );
            continue;
        }
        assert( Abc_ObjIsBox(pObj) );
        pNtkModel = (Abc_Ntk_t *)pObj->pData;
        Abc_NtkFillTemp( pNtkModel );
        // check the match between the number of actual and formal parameters
        assert( Abc_ObjFaninNum(pObj) == Abc_NtkPiNum(pNtkModel) );
        assert( Abc_ObjFanoutNum(pObj) == Abc_NtkPoNum(pNtkModel) );
        // assign PIs
        Abc_ObjForEachFanin( pObj, pTerm, k )
            Abc_ObjFanout0( Abc_NtkPi(pNtkModel, k) )->iTemp = Abc_ObjFanin0(pTerm)->iTemp;
        // call recursively
        Abc_NtkDeriveFlatGia_rec( pGia, pNtkModel );
        // assign POs
        Abc_ObjForEachFanout( pObj, pTerm, k )
            Abc_ObjFanout0(pTerm)->iTemp = Abc_ObjFanin0( Abc_NtkPo(pNtkModel, k) )->iTemp;
    }
    Abc_NtkForEachPo( pNtk, pTerm, i )
        assert( Abc_ObjFanin0(pTerm)->iTemp >= 0 );
}